

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int load_column(ParseData *lParse,int varNum,long fRow,long nRows,void *data,char *undef)

{
  int iVar1;
  iteratorCol *piVar2;
  long lVar3;
  size_t __size;
  int local_d8;
  uint local_d4;
  int anynul;
  int status;
  uchar *bytes;
  char msg [80];
  char **bitStrs;
  long idx;
  long len;
  long row;
  long nbytes;
  long nelem;
  iteratorCol *var;
  char *undef_local;
  void *data_local;
  long nRows_local;
  long fRow_local;
  int varNum_local;
  ParseData *lParse_local;
  
  local_d4 = 0;
  piVar2 = lParse->colData + varNum;
  if (lParse->hdutype == 0) {
    ffgpf(piVar2->fptr,piVar2->datatype,fRow,nRows,data,undef,&local_d8,(int *)&local_d4);
    if (DEBUG_PIXFILTER != 0) {
      printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",fRow,nRows,(ulong)local_d4);
    }
  }
  else {
    lVar3 = nRows * piVar2->repeat;
    iVar1 = piVar2->datatype;
    if (iVar1 == 0xb) {
      __size = ((piVar2->repeat + 7) / 8) * nRows;
      _anynul = (uchar *)malloc(__size);
      ffgcvb(piVar2->fptr,piVar2->colnum,fRow,1,__size,'\0',_anynul,&local_d8,(int *)&local_d4);
      lVar3 = piVar2->repeat;
      for (len = 0; len < nRows; len = len + 1) {
        bitStrs = (char **)(len * ((lVar3 + 7) / 8) + 1);
        for (idx = 0; idx < lVar3; idx = idx + 1) {
          if (((uint)_anynul[(long)bitStrs] & 1 << (7U - (char)(idx % 8) & 0x1f)) == 0) {
            *(undefined1 *)(*(long *)((long)data + len * 8) + idx) = 0x30;
          }
          else {
            *(undefined1 *)(*(long *)((long)data + len * 8) + idx) = 0x31;
          }
          if (idx % 8 == 7) {
            bitStrs = (char **)((long)bitStrs + 1);
          }
        }
        *(undefined1 *)(*(long *)((long)data + len * 8) + idx) = 0;
      }
      msg._72_8_ = data;
      if (_anynul == (uchar *)0x0) {
        printf("invalid free((char *)bytes) at %s:%d\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Starlink[P]cfitsio/eval_f.c",
               0xa6e);
      }
      else {
        free(_anynul);
      }
    }
    else if (iVar1 == 0xe) {
      ffgcfl(piVar2->fptr,piVar2->colnum,fRow,1,lVar3,(char *)data,undef,&local_d8,(int *)&local_d4)
      ;
    }
    else if (iVar1 == 0x10) {
      ffgcfs(piVar2->fptr,piVar2->colnum,fRow,1,nRows,(char **)data,undef,&local_d8,(int *)&local_d4
            );
    }
    else if (iVar1 == 0x29) {
      ffgcfj(piVar2->fptr,piVar2->colnum,fRow,1,lVar3,(long *)data,undef,&local_d8,(int *)&local_d4)
      ;
    }
    else if (iVar1 == 0x52) {
      ffgcfd(piVar2->fptr,piVar2->colnum,fRow,1,lVar3,(double *)data,undef,&local_d8,
             (int *)&local_d4);
    }
    else {
      snprintf((char *)&bytes,0x50,"load_column: unexpected datatype %d",
               (ulong)(uint)piVar2->datatype);
      ffpmsg((char *)&bytes);
    }
  }
  if (local_d4 == 0) {
    lParse_local._4_4_ = 0;
  }
  else {
    lParse->status = local_d4;
    lParse_local._4_4_ = -1;
  }
  return lParse_local._4_4_;
}

Assistant:

static int load_column( ParseData *lParse, int varNum, long fRow, long nRows,
                        void *data, char *undef )
{
   iteratorCol *var;
   long nelem,nbytes,row,len,idx;
   char **bitStrs, msg[80];
   unsigned char *bytes;
   int status = 0, anynul;

   var = lParse->colData+varNum;
   if (lParse->hdutype == IMAGE_HDU) {
    /* This test would need to be on a per varNum basis to support
     * cross HDU operations */
    fits_read_imgnull(var->fptr, var->datatype, fRow, nRows,
                data, undef, &anynul, &status);
    if (DEBUG_PIXFILTER)
        printf("load_column: IMAGE_HDU fRow=%ld, nRows=%ld => %d\n",
                        fRow, nRows, status);
  } else { 

   nelem = nRows * var->repeat;

   switch( var->datatype ) {
   case TBYTE:
      nbytes = ((var->repeat+7)/8) * nRows;
      bytes = (unsigned char *)malloc( nbytes * sizeof(char) );

      ffgcvb(var->fptr, var->colnum, fRow, 1L, nbytes,
             0, bytes, &anynul, &status);

      nelem = var->repeat;
      bitStrs = (char **)data;
      for( row=0; row<nRows; row++ ) {
         idx = (row)*( (nelem+7)/8 ) + 1;
         for(len=0; len<nelem; len++) {
            if( bytes[idx] & (1<<(7-len%8)) )
               bitStrs[row][len] = '1';
            else
               bitStrs[row][len] = '0';
            if( len%8==7 ) idx++;
         }
         bitStrs[row][len] = '\0';
      }

      FREE( (char *)bytes );
      break;
   case TSTRING:
      ffgcfs(var->fptr, var->colnum, fRow, 1L, nRows,
             (char **)data, undef, &anynul, &status);
      break;
   case TLOGICAL:
      ffgcfl(var->fptr, var->colnum, fRow, 1L, nelem,
             (char *)data, undef, &anynul, &status);
      break;
   case TLONG:
      ffgcfj(var->fptr, var->colnum, fRow, 1L, nelem,
             (long *)data, undef, &anynul, &status);
      break;
   case TDOUBLE:
      ffgcfd(var->fptr, var->colnum, fRow, 1L, nelem,
             (double *)data, undef, &anynul, &status);
      break;
   default:
      snprintf(msg,80,"load_column: unexpected datatype %d", var->datatype);
      ffpmsg(msg);
   }
  }
   if( status ) {
      lParse->status = status;
      return pERROR;
   }

   return 0;
}